

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_log_unregister_callback(ma_log *pLog,ma_log_callback callback)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ma_log_callback *pmVar5;
  
  if (pLog != (ma_log *)0x0) {
    uVar3 = (ulong)pLog->callbackCount;
    if (pLog->callbackCount != 0) {
      uVar1 = 0;
      do {
        uVar4 = (ulong)uVar1;
        if (pLog->callbacks[uVar4].onLog == callback.onLog) {
          uVar2 = (int)uVar3 - 1;
          uVar3 = (ulong)uVar2;
          if (uVar1 < uVar2) {
            pmVar5 = pLog->callbacks + uVar4 + 1;
            do {
              uVar4 = uVar4 + 1;
              pmVar5[-1].onLog = pmVar5->onLog;
              *(void **)((long)(pmVar5 + -1) + 8) = pmVar5->pUserData;
              uVar3 = (ulong)(pLog->callbackCount - 1);
              pmVar5 = pmVar5 + 1;
            } while (uVar4 < uVar3);
          }
          pLog->callbackCount = (ma_uint32)uVar3;
        }
        else {
          uVar1 = uVar1 + 1;
        }
      } while (uVar1 < (uint)uVar3);
    }
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_log_unregister_callback(ma_log* pLog, ma_log_callback callback)
{
    if (pLog == NULL) {
        return MA_INVALID_ARGS;
    }

    ma_log_lock(pLog);
    {
        ma_uint32 iLog;
        for (iLog = 0; iLog < pLog->callbackCount; ) {
            if (pLog->callbacks[iLog].onLog == callback.onLog) {
                /* Found. Move everything down a slot. */
                ma_uint32 jLog;
                for (jLog = iLog; jLog < pLog->callbackCount-1; jLog += 1) {
                    pLog->callbacks[jLog] = pLog->callbacks[jLog + 1];
                }

                pLog->callbackCount -= 1;
            } else {
                /* Not found. */
                iLog += 1;
            }
        }
    }
    ma_log_unlock(pLog);

    return MA_SUCCESS;
}